

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

Files * __thiscall
cmInstallTargetGenerator::GetFiles
          (Files *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  size_type *psVar1;
  NamelinkModeType NVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  bool bVar4;
  TargetType TVar5;
  cmLocalGenerator *pcVar6;
  cmMakefile *this_01;
  string *psVar7;
  cmGlobalGenerator *this_02;
  cmake *this_03;
  cmListFileBacktrace *backtrace;
  ulong uVar8;
  size_type sVar9;
  size_type sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined1 local_768 [8];
  string toRealName;
  string fromRealName;
  undefined1 local_708 [8];
  string toSOName;
  string fromSOName;
  string toName;
  string fromName;
  undefined1 local_680 [7];
  bool haveNamelink;
  string to1_4;
  string from1_4;
  string targetNameBase;
  string to1_3;
  undefined1 local_5e0 [8];
  string from1_3;
  undefined1 local_5a0 [8];
  string e;
  undefined1 local_560 [8];
  string targetNameImportLib_1;
  string to1_2;
  string from1_2;
  Names targetNames_1;
  string to2;
  string from2;
  string local_3f8;
  cmValue local_3d8;
  cmValue p;
  string ext;
  cmMakefile *mf;
  string to1_1;
  string from1_1;
  undefined1 local_348 [8];
  string targetNameImportLib;
  string to1;
  string from1;
  Names targetNames;
  string local_1f8;
  cmAlphaNum local_1d8;
  string local_1a8;
  ArtifactType local_184;
  undefined1 local_180 [4];
  ArtifactType artifact;
  cmAlphaNum local_150;
  string local_120;
  undefined1 local_100 [8];
  string fromDirConfig;
  string local_d8;
  int local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  string *obj;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_70;
  undefined1 local_50 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  TargetType targetType;
  string *config_local;
  cmInstallTargetGenerator *this_local;
  Files *files;
  
  bVar4 = false;
  Files::Files(__return_storage_ptr__);
  TVar5 = cmGeneratorTarget::GetType(this->Target);
  switch(TVar5) {
  case EXECUTABLE:
    __return_storage_ptr__->Type = cmInstallType_EXECUTABLE;
    break;
  case STATIC_LIBRARY:
    __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
    break;
  case SHARED_LIBRARY:
    __return_storage_ptr__->Type = cmInstallType_SHARED_LIBRARY;
    break;
  case MODULE_LIBRARY:
    __return_storage_ptr__->Type = cmInstallType_MODULE_LIBRARY;
    break;
  case OBJECT_LIBRARY:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50);
    cmGeneratorTarget::GetTargetObjectNames
              (this->Target,config,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_50);
    __return_storage_ptr__->Type = cmInstallType_FILES;
    __return_storage_ptr__->NoTweak = true;
    cmGeneratorTarget::GetObjectDirectory(&local_70,this->Target,config);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FromDir,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    anon_unknown.dwarf_10a45e4::computeInstallObjectDir((string *)&__range2,this->Target,config);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->ToDir,(string *)&__range2);
    std::__cxx11::string::~string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50);
    obj = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&obj), bVar4) {
      local_b0 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,local_b0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,local_b0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar4 = true;
    local_b4 = 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    goto LAB_007c7a5f;
  case UTILITY:
  case GLOBAL_TARGET:
  case UNKNOWN_LIBRARY:
    pcVar6 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"cmInstallTargetGenerator created with non-installable target.",
               (allocator<char> *)(fromDirConfig.field_2._M_local_buf + 0xf));
    cmLocalGenerator::IssueMessage(pcVar6,INTERNAL_ERROR,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)(fromDirConfig.field_2._M_local_buf + 0xf));
    bVar4 = true;
    local_b4 = 1;
    goto LAB_007c7a5f;
  case INTERFACE_LIBRARY:
    __assert_fail("false && \"INTERFACE_LIBRARY targets have no installable outputs.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0x8c,
                  "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                 );
  }
  std::__cxx11::string::string((string *)local_100);
  bVar3 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,config);
  if (bVar3) {
    pcVar6 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar6);
    cmAlphaNum::cmAlphaNum(&local_150,psVar7);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_180,"/CMakeFiles/CMakeRelink.dir/");
    cmStrCat<>(&local_120,&local_150,(cmAlphaNum *)local_180);
    std::__cxx11::string::operator=((string *)local_100,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    local_184 = this->ImportLibrary & ImportLibraryArtifact;
    cmGeneratorTarget::GetDirectory(&local_1f8,this->Target,config,local_184);
    cmAlphaNum::cmAlphaNum(&local_1d8,&local_1f8);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&targetNames.SharedObject.field_2 + 8),'/');
    cmStrCat<>(&local_1a8,&local_1d8,(cmAlphaNum *)((long)&targetNames.SharedObject.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_100,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  if (TVar5 == EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assert_fail("this->NamelinkMode == NamelinkModeNone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0xb8,
                    "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                   );
    }
    cmGeneratorTarget::GetExecutableNames((Names *)((long)&from1.field_2 + 8),this->Target,config);
    if ((this->ImportLibrary & 1U) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1_1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames.Base.field_2 + 8));
      std::__cxx11::string::string
                ((string *)&mf,(string *)(targetNames.Base.field_2._M_local_buf + 8));
      bVar4 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar4) {
        this_01 = cmTarget::GetMakefile(this->Target->Target);
        std::__cxx11::string::string((string *)&p);
        this_00 = this->Target;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f8,"BUNDLE_EXTENSION",
                   (allocator<char> *)(from2.field_2._M_local_buf + 0xf));
        local_3d8 = cmGeneratorTarget::GetProperty(this_00,&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::allocator<char>::~allocator((allocator<char> *)(from2.field_2._M_local_buf + 0xf));
        bVar4 = cmValue::operator_cast_to_bool(&local_3d8);
        if (bVar4) {
          psVar7 = cmValue::operator*[abi_cxx11_(&local_3d8);
          std::__cxx11::string::operator=((string *)&p,(string *)psVar7);
        }
        else {
          std::__cxx11::string::operator=((string *)&p,"app");
        }
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::__cxx11::string::operator+=((string *)(to1_1.field_2._M_local_buf + 8),".");
        std::__cxx11::string::operator+=((string *)(to1_1.field_2._M_local_buf + 8),(string *)&p);
        std::__cxx11::string::operator+=((string *)&mf,".");
        std::__cxx11::string::operator+=((string *)&mf,(string *)&p);
        std::__cxx11::string::operator+=((string *)&mf,"/");
        bVar4 = cmMakefile::PlatformIsAppleEmbedded(this_01);
        if (!bVar4) {
          std::__cxx11::string::operator+=((string *)&mf,"Contents/MacOS/");
        }
        std::__cxx11::string::operator+=
                  ((string *)&mf,(string *)(targetNames.Base.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)&p);
      }
      else {
        bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&targetNames.Output.field_2 + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&targetNames.Base.field_2 + 8));
        if (bVar4) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&to2.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&targetNames.Output.field_2 + 8));
          std::__cxx11::string::string
                    ((string *)(targetNames_1.SharedObject.field_2._M_local_buf + 8),
                     (string *)(targetNames.Output.field_2._M_local_buf + 8));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to2.field_2 + 8));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames_1.SharedObject.field_2 + 8));
          std::__cxx11::string::~string
                    ((string *)(targetNames_1.SharedObject.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(to2.field_2._M_local_buf + 8));
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&to1_1.field_2 + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mf);
      std::__cxx11::string::~string((string *)&mf);
      std::__cxx11::string::~string((string *)(to1_1.field_2._M_local_buf + 8));
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames.Real.field_2 + 8));
      std::__cxx11::string::string
                ((string *)(targetNameImportLib.field_2._M_local_buf + 8),
                 (string *)(targetNames.Real.field_2._M_local_buf + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&to1.field_2 + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetNameImportLib.field_2 + 8));
      std::__cxx11::string::string((string *)local_348);
      bVar4 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,(string *)((long)&targetNames.Real.field_2 + 8),
                         (string *)local_348,(char *)0x0);
      if (bVar4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&from1_1.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_348);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&from1_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(from1_1.field_2._M_local_buf + 8));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
      }
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
      std::__cxx11::string::~string((string *)local_348);
      std::__cxx11::string::~string((string *)(targetNameImportLib.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(to1.field_2._M_local_buf + 8));
    }
    cmGeneratorTarget::Names::~Names((Names *)((long)&from1.field_2 + 8));
LAB_007c79e2:
    sVar9 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&__return_storage_ptr__->From);
    sVar10 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&__return_storage_ptr__->To);
    if (sVar9 != sVar10) {
      __assert_fail("files.From.size() == files.To.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0x181,
                    "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                   );
    }
    bVar4 = true;
    local_b4 = 1;
  }
  else {
    cmGeneratorTarget::GetLibraryNames((Names *)((long)&from1_2.field_2 + 8),this->Target,config);
    if ((this->ImportLibrary & 1U) == 0) {
      bVar3 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar3) {
        bVar3 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
        if (bVar3) {
          __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
          __return_storage_ptr__->UseSourcePermissions = true;
          psVar1 = &targetNames_1.Base.field_2._M_allocated_capacity + 1;
          std::__cxx11::string::find((char)psVar1,0x2f);
          std::__cxx11::string::substr((ulong)((long)&from1_4.field_2 + 8),(ulong)psVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&to1_4.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&from1_4.field_2 + 8));
          std::__cxx11::string::string
                    ((string *)local_680,(string *)(targetNames_1.Base.field_2._M_local_buf + 8));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1_4.field_2 + 8));
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &__return_storage_ptr__->To,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680)
          ;
          std::__cxx11::string::~string((string *)local_680);
          std::__cxx11::string::~string((string *)(to1_4.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(from1_4.field_2._M_local_buf + 8));
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&toName.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&targetNames_1.Base.field_2 + 8));
          std::__cxx11::string::string
                    ((string *)(fromSOName.field_2._M_local_buf + 8),
                     (string *)(targetNames_1.Base.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(toSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_708);
          fromName.field_2._M_local_buf[0xf] =
               std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&targetNames_1.PDB.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&targetNames_1.Base.field_2 + 8));
          if ((bool)fromName.field_2._M_local_buf[0xf]) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&fromRealName.field_2 + 8),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&targetNames_1.PDB.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)(toSOName.field_2._M_local_buf + 8),
                       (string *)(fromRealName.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(fromRealName.field_2._M_local_buf + 8));
            std::__cxx11::string::operator=
                      ((string *)local_708,(string *)(targetNames_1.PDB.field_2._M_local_buf + 8));
          }
          std::__cxx11::string::string((string *)(toRealName.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_768);
          bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNames_1.Output.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&targetNames_1.Base.field_2 + 8));
          if ((bVar3) &&
             (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&targetNames_1.Output.field_2 + 8),
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&targetNames_1.PDB.field_2 + 8)), bVar3)) {
            fromName.field_2._M_local_buf[0xf] = '\x01';
            std::operator+(&local_788,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&targetNames_1.Output.field_2 + 8));
            std::__cxx11::string::operator=
                      ((string *)(toRealName.field_2._M_local_buf + 8),(string *)&local_788);
            std::__cxx11::string::~string((string *)&local_788);
            std::__cxx11::string::operator=
                      ((string *)local_768,(string *)(targetNames_1.Output.field_2._M_local_buf + 8)
                      );
          }
          if (fromName.field_2._M_local_buf[0xf] == '\0') {
            if (this->NamelinkMode != NamelinkModeOnly) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&toName.field_2 + 8));
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &__return_storage_ptr__->To,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&fromSOName.field_2 + 8));
            }
          }
          else {
            __return_storage_ptr__->NamelinkMode = this->NamelinkMode;
            if (this->NamelinkMode == NamelinkModeOnly) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&toName.field_2 + 8));
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &__return_storage_ptr__->To,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&fromSOName.field_2 + 8));
            }
            else {
              uVar8 = std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&toRealName.field_2 + 8));
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &__return_storage_ptr__->To,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_768);
              }
              uVar8 = std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&toSOName.field_2 + 8));
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &__return_storage_ptr__->To,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_708);
              }
              if (this->NamelinkMode != NamelinkModeSkip) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&toName.field_2 + 8));
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &__return_storage_ptr__->To,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&fromSOName.field_2 + 8));
              }
            }
          }
          std::__cxx11::string::~string((string *)local_768);
          std::__cxx11::string::~string((string *)(toRealName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_708);
          std::__cxx11::string::~string((string *)(toSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(fromSOName.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(toName.field_2._M_local_buf + 8));
        }
        goto LAB_007c79b0;
      }
      NVar2 = this->NamelinkMode;
      if (NVar2 == NamelinkModeNone) {
LAB_007c738e:
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5e0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&targetNames_1.Base.field_2 + 8));
        cmsys::SystemTools::GetFilenamePath
                  ((string *)((long)&to1_3.field_2 + 8),(string *)local_5e0);
        std::__cxx11::string::operator=
                  ((string *)local_5e0,(string *)(to1_3.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(to1_3.field_2._M_local_buf + 8));
        std::__cxx11::string::string
                  ((string *)(targetNameBase.field_2._M_local_buf + 8),
                   (string *)(targetNames_1.Output.field_2._M_local_buf + 8));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&targetNameBase.field_2 + 8));
        std::__cxx11::string::~string((string *)(targetNameBase.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_5e0);
        goto LAB_007c79b0;
      }
      if (NVar2 != NamelinkModeOnly) {
        if (NVar2 == NamelinkModeSkip) {
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&from1_3.field_2 + 8),"Target \'",psVar7);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&from1_3.field_2 + 8),
                         "\' was changed to a FRAMEWORK sometime after install().  This may result in the wrong install DESTINATION.  Set the FRAMEWORK property earlier."
                        );
          std::__cxx11::string::~string((string *)(from1_3.field_2._M_local_buf + 8));
          this_02 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
          this_03 = cmGlobalGenerator::GetCMakeInstance(this_02);
          backtrace = cmInstallGenerator::GetBacktrace(&this->super_cmInstallGenerator);
          cmake::IssueMessage(this_03,AUTHOR_WARNING,(string *)local_5a0,backtrace);
          std::__cxx11::string::~string((string *)local_5a0);
        }
        goto LAB_007c738e;
      }
      bVar4 = true;
      local_b4 = 1;
    }
    else {
      if (this->NamelinkMode != NamelinkModeNone) {
        __assert_fail("this->NamelinkMode == NamelinkModeNone",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,0xfa,
                      "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                     );
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&to1_2.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&targetNames_1.Real.field_2 + 8));
      std::__cxx11::string::string
                ((string *)(targetNameImportLib_1.field_2._M_local_buf + 8),
                 (string *)(targetNames_1.Real.field_2._M_local_buf + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&to1_2.field_2 + 8));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&targetNameImportLib_1.field_2 + 8));
      std::__cxx11::string::string((string *)local_560);
      bVar3 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,(string *)((long)&targetNames_1.Real.field_2 + 8),
                         (string *)local_560,(char *)0x0);
      if (bVar3) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&e.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_100,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_560);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&e.field_2 + 8));
        std::__cxx11::string::~string((string *)(e.field_2._M_local_buf + 8));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560);
      }
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
      std::__cxx11::string::~string((string *)local_560);
      std::__cxx11::string::~string((string *)(targetNameImportLib_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(to1_2.field_2._M_local_buf + 8));
LAB_007c79b0:
      local_b4 = 0;
    }
    cmGeneratorTarget::Names::~Names((Names *)((long)&from1_2.field_2 + 8));
    if (local_b4 == 0) goto LAB_007c79e2;
  }
  std::__cxx11::string::~string((string *)local_100);
LAB_007c7a5f:
  if (!bVar4) {
    Files::~Files(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(
  std::string const& config) const
{
  Files files;

  cmStateEnums::TargetType targetType = this->Target->GetType();
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      files.Type = cmInstallType_EXECUTABLE;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      files.Type = cmInstallType_STATIC_LIBRARY;
      break;
    case cmStateEnums::SHARED_LIBRARY:
      files.Type = cmInstallType_SHARED_LIBRARY;
      break;
    case cmStateEnums::MODULE_LIBRARY:
      files.Type = cmInstallType_MODULE_LIBRARY;
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(false &&
             "INTERFACE_LIBRARY targets have no installable outputs.");
      break;

    case cmStateEnums::OBJECT_LIBRARY: {
      // Compute all the object files inside this target
      std::vector<std::string> objects;
      this->Target->GetTargetObjectNames(config, objects);

      files.Type = cmInstallType_FILES;
      files.NoTweak = true;
      files.FromDir = this->Target->GetObjectDirectory(config);
      files.ToDir = computeInstallObjectDir(this->Target, config);
      for (std::string& obj : objects) {
        files.From.emplace_back(obj);
        files.To.emplace_back(std::move(obj));
      }
      return files;
    }

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return files;
  }

  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if (this->Target->NeedRelinkBeforeInstall(config)) {
    fromDirConfig =
      cmStrCat(this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeRelink.dir/");
  } else {
    cmStateEnums::ArtifactType artifact = this->ImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    fromDirConfig =
      cmStrCat(this->Target->GetDirectory(config, artifact), '/');
  }

  if (targetType == cmStateEnums::EXECUTABLE) {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    cmGeneratorTarget::Names targetNames =
      this->Target->GetExecutableNames(config);
    if (this->ImportLibrary) {
      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = targetNames.ImportLibrary;
      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        files.From.emplace_back(fromDirConfig + targetNameImportLib);
        files.To.emplace_back(targetNameImportLib);
      }

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else {
      std::string from1 = fromDirConfig + targetNames.Output;
      std::string to1 = targetNames.Output;

      // Handle OSX Bundles.
      if (this->Target->IsAppBundleOnApple()) {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Get App Bundle Extension
        std::string ext;
        if (cmValue p = this->Target->GetProperty("BUNDLE_EXTENSION")) {
          ext = *p;
        } else {
          ext = "app";
        }

        // Install the whole app bundle directory.
        files.Type = cmInstallType_DIRECTORY;
        files.UseSourcePermissions = true;
        from1 += ".";
        from1 += ext;

        // Tweaks apply to the binary inside the bundle.
        to1 += ".";
        to1 += ext;
        to1 += "/";
        if (!mf->PlatformIsAppleEmbedded()) {
          to1 += "Contents/MacOS/";
        }
        to1 += targetNames.Output;
      } else {
        // Tweaks apply to the real file, so list it first.
        if (targetNames.Real != targetNames.Output) {
          std::string from2 = fromDirConfig + targetNames.Real;
          std::string to2 = targetNames.Real;
          files.From.emplace_back(std::move(from2));
          files.To.emplace_back(std::move(to2));
        }
      }

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    }
  } else {
    cmGeneratorTarget::Names targetNames =
      this->Target->GetLibraryNames(config);
    if (this->ImportLibrary) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->NamelinkMode == NamelinkModeNone);

      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = targetNames.ImportLibrary;
      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        files.From.emplace_back(fromDirConfig + targetNameImportLib);
        files.To.emplace_back(targetNameImportLib);
      }

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else if (this->Target->IsFrameworkOnApple()) {
      // FIXME: In principle we should be able to
      //   assert(this->NamelinkMode == NamelinkModeNone);
      // but since the current install() command implementation checks
      // the FRAMEWORK property immediately instead of delaying until
      // generate time, it is possible for project code to set the
      // property after calling install().  In such a case, the install()
      // command will use the LIBRARY code path and create two install
      // generators, one for the namelink component (NamelinkModeOnly)
      // and one for the primary artifact component (NamelinkModeSkip).
      // Historically this was not diagnosed and resulted in silent
      // installation of a framework to the LIBRARY destination.
      // Retain that behavior and warn about the case.
      switch (this->NamelinkMode) {
        case NamelinkModeNone:
          // Normal case.
          break;
        case NamelinkModeOnly:
          // Assume the NamelinkModeSkip instance will warn and install.
          return files;
        case NamelinkModeSkip: {
          std::string e = "Target '" + this->Target->GetName() +
            "' was changed to a FRAMEWORK sometime after install().  "
            "This may result in the wrong install DESTINATION.  "
            "Set the FRAMEWORK property earlier.";
          this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
            MessageType::AUTHOR_WARNING, e, this->GetBacktrace());
        } break;
      }

      // Install the whole framework directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string from1 = fromDirConfig + targetNames.Output;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = targetNames.Real;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else if (this->Target->IsCFBundleOnApple()) {
      // Install the whole app bundle directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string targetNameBase =
        targetNames.Output.substr(0, targetNames.Output.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = targetNames.Output;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else {
      bool haveNamelink = false;

      // Library link name.
      std::string fromName = fromDirConfig + targetNames.Output;
      std::string toName = targetNames.Output;

      // Library interface name.
      std::string fromSOName;
      std::string toSOName;
      if (targetNames.SharedObject != targetNames.Output) {
        haveNamelink = true;
        fromSOName = fromDirConfig + targetNames.SharedObject;
        toSOName = targetNames.SharedObject;
      }

      // Library implementation name.
      std::string fromRealName;
      std::string toRealName;
      if (targetNames.Real != targetNames.Output &&
          targetNames.Real != targetNames.SharedObject) {
        haveNamelink = true;
        fromRealName = fromDirConfig + targetNames.Real;
        toRealName = targetNames.Real;
      }

      // Add the names based on the current namelink mode.
      if (haveNamelink) {
        files.NamelinkMode = this->NamelinkMode;
        // With a namelink we need to check the mode.
        if (this->NamelinkMode == NamelinkModeOnly) {
          // Install the namelink only.
          files.From.emplace_back(fromName);
          files.To.emplace_back(toName);
        } else {
          // Install the real file if it has its own name.
          if (!fromRealName.empty()) {
            files.From.emplace_back(fromRealName);
            files.To.emplace_back(toRealName);
          }

          // Install the soname link if it has its own name.
          if (!fromSOName.empty()) {
            files.From.emplace_back(fromSOName);
            files.To.emplace_back(toSOName);
          }

          // Install the namelink if it is not to be skipped.
          if (this->NamelinkMode != NamelinkModeSkip) {
            files.From.emplace_back(fromName);
            files.To.emplace_back(toName);
          }
        }
      } else {
        // Without a namelink there will be only one file.  Install it
        // if this is not a namelink-only rule.
        if (this->NamelinkMode != NamelinkModeOnly) {
          files.From.emplace_back(fromName);
          files.To.emplace_back(toName);
        }
      }
    }
  }

  // If this fails the above code is buggy.
  assert(files.From.size() == files.To.size());

  return files;
}